

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

char * lmemfind(char *s1,size_t l1,char *s2,size_t l2)

{
  int iVar1;
  char *__s1;
  bool bVar2;
  char *local_38;
  char *init;
  size_t l2_local;
  char *s2_local;
  size_t l1_local;
  char *s1_local;
  
  s1_local = s1;
  if (l2 != 0) {
    if (l1 < l2) {
      s1_local = (char *)0x0;
    }
    else {
      s2_local = (char *)(l1 - (l2 - 1));
      l1_local = (size_t)s1;
      while( true ) {
        bVar2 = false;
        if (s2_local != (char *)0x0) {
          local_38 = (char *)memchr((void *)l1_local,(int)*s2,(size_t)s2_local);
          bVar2 = local_38 != (char *)0x0;
        }
        if (!bVar2) {
          return (char *)0x0;
        }
        __s1 = local_38 + 1;
        iVar1 = memcmp(__s1,s2 + 1,l2 - 1);
        if (iVar1 == 0) break;
        s2_local = s2_local + -((long)__s1 - l1_local);
        local_38 = __s1;
        l1_local = (size_t)__s1;
      }
      s1_local = local_38;
    }
  }
  return s1_local;
}

Assistant:

static const char *lmemfind (const char *s1, size_t l1,
                               const char *s2, size_t l2) {
  if (l2 == 0) return s1;  /* empty strings are everywhere */
  else if (l2 > l1) return NULL;  /* avoids a negative 'l1' */
  else {
    const char *init;  /* to search for a '*s2' inside 's1' */
    l2--;  /* 1st char will be checked by 'memchr' */
    l1 = l1-l2;  /* 's2' cannot be found after that */
    while (l1 > 0 && (init = (const char *)memchr(s1, *s2, l1)) != NULL) {
      init++;   /* 1st char is already checked */
      if (memcmp(init, s2+1, l2) == 0)
        return init-1;
      else {  /* correct 'l1' and 's1' to try again */
        l1 -= init-s1;
        s1 = init;
      }
    }
    return NULL;  /* not found */
  }
}